

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_compression_type.cpp
# Opt level: O2

FileCompressionType duckdb::FileCompressionTypeFromString(string *input)

{
  bool bVar1;
  ParserException *this;
  FileCompressionType FVar2;
  allocator local_79;
  string parameter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  StringUtil::Lower(&parameter,input);
  bVar1 = ::std::operator==(&parameter,"infer");
  if (!bVar1) {
    bVar1 = ::std::operator==(&parameter,"auto");
    if (!bVar1) {
      bVar1 = ::std::operator==(&parameter,"gzip");
      FVar2 = GZIP;
      if (!bVar1) {
        bVar1 = ::std::operator==(&parameter,"zstd");
        FVar2 = ZSTD;
        if (!bVar1) {
          bVar1 = ::std::operator==(&parameter,"uncompressed");
          FVar2 = UNCOMPRESSED;
          if (!bVar1) {
            bVar1 = ::std::operator==(&parameter,"none");
            if ((!bVar1) && (parameter._M_string_length != 0)) {
              this = (ParserException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_38,"Unrecognized file compression type \"%s\"",&local_79);
              ::std::__cxx11::string::string((string *)&local_58,(string *)input);
              ParserException::ParserException<std::__cxx11::string>(this,&local_38,&local_58);
              __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
        }
      }
      goto LAB_012616af;
    }
  }
  FVar2 = AUTO_DETECT;
LAB_012616af:
  ::std::__cxx11::string::~string((string *)&parameter);
  return FVar2;
}

Assistant:

FileCompressionType FileCompressionTypeFromString(const string &input) {
	auto parameter = StringUtil::Lower(input);
	if (parameter == "infer" || parameter == "auto") {
		return FileCompressionType::AUTO_DETECT;
	} else if (parameter == "gzip") {
		return FileCompressionType::GZIP;
	} else if (parameter == "zstd") {
		return FileCompressionType::ZSTD;
	} else if (parameter == "uncompressed" || parameter == "none" || parameter.empty()) {
		return FileCompressionType::UNCOMPRESSED;
	} else {
		throw ParserException("Unrecognized file compression type \"%s\"", input);
	}
}